

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void UpdateRelativeMouseMode(void)

{
  bool bVar1;
  SDL_bool SVar2;
  
  if (VideoWindow20 != (SDL_Window *)0x0) {
    bVar1 = VideoCursorHidden != SDL_FALSE && VideoWindowGrabbed != SDL_FALSE;
    SVar2 = (SDL_bool)bVar1;
    if (MouseInputIsRelative != SVar2) {
      MouseInputIsRelative = SVar2;
      (*SDL20_SetRelativeMouseMode)((uint)bVar1);
      return;
    }
  }
  return;
}

Assistant:

static void
UpdateRelativeMouseMode(void)
{
    /* in SDL 1.2, hiding+grabbing the cursor was like SDL2's relative mouse mode. */
    if (VideoWindow20) {
        const SDL_bool enable = (VideoWindowGrabbed && VideoCursorHidden) ? SDL_TRUE : SDL_FALSE;
        if (MouseInputIsRelative != enable) {
            MouseInputIsRelative = enable;
            SDL20_SetRelativeMouseMode(MouseInputIsRelative);
        }
    }
}